

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O3

void __thiscall
t_ocaml_generator::generate_deserialize_struct
          (t_ocaml_generator *this,ostream *out,t_struct *tstruct)

{
  t_program *ptVar1;
  pointer pcVar2;
  long lVar3;
  char *pcVar4;
  int iVar5;
  long *plVar6;
  undefined4 extraout_var;
  ostream *poVar7;
  long *plVar8;
  string name;
  string prefix;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  char *local_b0;
  undefined8 local_a8;
  char local_a0 [8];
  undefined8 uStack_98;
  long *local_90;
  long local_88;
  undefined1 local_80 [8];
  long lStack_78;
  char *local_70;
  long local_68;
  char local_60 [16];
  char *local_50;
  undefined8 local_48;
  char local_40 [8];
  undefined8 uStack_38;
  
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  ptVar1 = (tstruct->super_t_type).program_;
  if ((ptVar1 != (t_program *)0x0) &&
     (ptVar1 != (this->super_t_oop_generator).super_t_generator.program_)) {
    pcVar2 = (ptVar1->name_)._M_dataplus._M_p;
    local_b0 = local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,pcVar2 + (ptVar1->name_)._M_string_length);
    pcVar4 = local_b0;
    iVar5 = toupper((int)*local_b0);
    *pcVar4 = (char)iVar5;
    if (local_b0 == local_a0) {
      uStack_38 = uStack_98;
      local_50 = local_40;
    }
    else {
      local_50 = local_b0;
    }
    local_48 = local_a8;
    local_a8 = 0;
    local_a0[0] = '\0';
    local_b0 = local_a0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_c0 = *plVar8;
      lStack_b8 = plVar6[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar8;
      local_d0 = (long *)*plVar6;
    }
    local_c8 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_d0);
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    if (local_b0 != local_a0) {
      operator_delete(local_b0);
    }
  }
  iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  lVar3 = *(long *)CONCAT44(extraout_var,iVar5);
  local_90 = (long *)local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,lVar3,((long *)CONCAT44(extraout_var,iVar5))[1] + lVar3);
  plVar6 = local_90;
  iVar5 = tolower((int)(char)*local_90);
  *(char *)plVar6 = (char)iVar5;
  if (local_90 == (long *)local_80) {
    lStack_b8 = lStack_78;
    local_d0 = &local_c0;
  }
  else {
    local_d0 = local_90;
  }
  local_c8 = local_88;
  local_88 = 0;
  local_80[0] = 0;
  local_90 = (long *)local_80;
  std::__ostream_insert<char,std::char_traits<char>>(out,"(",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(out,local_70,local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"read_",5);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_d0,local_c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," iprot)",7);
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void t_ocaml_generator::generate_deserialize_struct(ostream& out, t_struct* tstruct) {
  string prefix = "";
  t_program* program = tstruct->get_program();
  if (program != nullptr && program != program_) {
    prefix = capitalize(program->get_name()) + "_types.";
  }
  string name = decapitalize(tstruct->get_name());
  out << "(" << prefix << "read_" << name << " iprot)";
}